

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

void __thiscall wasm::Asyncify::run(Asyncify *this,Module *module)

{
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var1;
  pointer puVar2;
  Export *pEVar3;
  pointer puVar4;
  char *pcVar5;
  size_t sVar6;
  Function *item;
  _List_node_base *p_Var7;
  _Alloc_hider _Var8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  Memory *pMVar12;
  undefined8 uVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  Expression *pEVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  _Rb_tree_node_base *p_Var19;
  _Base_ptr p_Var20;
  ostream *poVar21;
  Function *pFVar22;
  mapped_type *pmVar23;
  tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_> this_00;
  AsyncifyLocals *this_01;
  variant<wasm::Name,_wasm::HeapType> *pvVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *logging;
  Asyncify *pAVar25;
  undefined1 auVar26 [8];
  IString *pIVar27;
  string *psVar28;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_5;
  pointer puVar29;
  pointer puVar30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  undefined8 *puVar31;
  Module *pMVar32;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_4;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  Name name;
  Name name_00;
  Name name_01;
  string_view sVar37;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c30;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c08;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_be0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bb8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b90;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b68;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b40;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b18;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_af0;
  undefined1 local_ac8 [8];
  PatternMatcher onlyList_1;
  string local_9c8;
  string local_9a8;
  undefined1 local_988 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  renamings;
  string ignoreImports;
  Split listedImports;
  Split local_8f8;
  Split local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  undefined1 local_798 [8];
  ModuleAnalyzer analyzer;
  string prefix;
  undefined1 local_5f8 [8];
  string stateChangingImports;
  string removeListInput;
  string onlyListInput;
  _Any_data local_578;
  code *local_568;
  code *local_560;
  Function *local_558;
  Function *func_3;
  undefined1 local_548 [8];
  Split removeList;
  Split onlyList;
  vector<wasm::Name,_std::allocator<wasm::Name>_> funcsToDelete;
  undefined1 auStack_4e8 [8];
  PatternMatcher removeList_1;
  Split addList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  loggings;
  undefined1 local_3c8 [8];
  FuncSet instrumentedFuncs;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  undefined1 auStack_298 [8];
  string secondaryMemorySizeString;
  Type local_110;
  CallGraphPropertyAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::Info> scanner;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Base_ptr local_b0;
  undefined1 auStack_a8 [8];
  Type type;
  code *local_98;
  uint uStack_94;
  __node_base local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  size_t local_78;
  undefined1 local_70 [8];
  __uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_> local_68;
  __uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_> local_60;
  _Head_base<0UL,_wasm::Pass_*,_false> local_58;
  Module *local_50;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range4;
  bool allImportsCanChangeState;
  Asyncify *pAStack_40;
  char local_31;
  
  scanner.map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       (((this->super_Pass).runner)->options).optimizeLevel;
  pAStack_40 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_4e8,"asyncify-imports",(allocator<char> *)local_ac8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyzer.verbose,"",(allocator<char> *)local_798);
  Pass::getArgumentOrDefault
            ((string *)local_3c8,&pAStack_40->super_Pass,(string *)auStack_4e8,
             (string *)&analyzer.verbose);
  read_possible_response_file((string *)auStack_298,(string *)local_3c8);
  String::trim((string *)local_5f8,(string *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)&analyzer.verbose);
  std::__cxx11::string::~string((string *)auStack_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-ignore-imports",(allocator<char> *)auStack_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8,"",(allocator<char> *)&analyzer.verbose);
  Pass::getArgumentOrDefault
            ((string *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &pAStack_40->super_Pass,(string *)auStack_298,(string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)auStack_298);
  bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_5f8,"");
  if (bVar9) {
    __range4._3_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &renamings._M_t._M_impl.super__Rb_tree_header._M_node_count,"");
  }
  else {
    __range4._3_1_ = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8,",",(allocator<char> *)auStack_4e8);
  std::__cxx11::string::string((string *)auStack_298,(string *)local_3c8);
  String::Split::Split
            ((Split *)((long)&ignoreImports.field_2 + 8),(string *)local_5f8,
             (NewLineOr *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-ignore-indirect",(allocator<char> *)local_3c8);
  bVar10 = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-removelist",(allocator<char> *)auStack_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8,"",(allocator<char> *)&analyzer.verbose);
  Pass::getArgumentOrDefault
            ((string *)((long)&stateChangingImports.field_2 + 8),&pAStack_40->super_Pass,
             (string *)auStack_298,(string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)auStack_298);
  if (removeListInput._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,"asyncify-blacklist",(allocator<char> *)&analyzer.verbose);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_4e8,"",(allocator<char> *)local_ac8);
    Pass::getArgumentOrDefault
              ((string *)auStack_298,&pAStack_40->super_Pass,(string *)local_3c8,
               (string *)auStack_4e8);
    std::__cxx11::string::operator=
              ((string *)(stateChangingImports.field_2._M_local_buf + 8),(string *)auStack_298);
    std::__cxx11::string::~string((string *)auStack_298);
    std::__cxx11::string::~string((string *)auStack_4e8);
    std::__cxx11::string::~string((string *)local_3c8);
  }
  read_possible_response_file
            ((string *)local_3c8,(string *)((long)&stateChangingImports.field_2 + 8));
  String::trim((string *)auStack_298,(string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyzer.verbose,",",(allocator<char> *)local_ac8);
  std::__cxx11::string::string((string *)auStack_4e8,(string *)&analyzer.verbose);
  String::Split::Split((Split *)local_548,(string *)auStack_298,(NewLineOr *)auStack_4e8);
  std::__cxx11::string::~string((string *)auStack_4e8);
  std::__cxx11::string::~string((string *)&analyzer.verbose);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyzer.verbose,"asyncify-addlist",(allocator<char> *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_ac8,"",(allocator<char> *)local_988);
  Pass::getArgumentOrDefault
            ((string *)auStack_4e8,&pAStack_40->super_Pass,(string *)&analyzer.verbose,
             (string *)local_ac8);
  read_possible_response_file((string *)local_3c8,(string *)auStack_4e8);
  String::trim((string *)auStack_298,(string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_a8,",",(allocator<char> *)local_2d8._M_pod_data);
  std::__cxx11::string::string((string *)local_798,(string *)auStack_a8);
  String::Split::Split
            ((Split *)&removeList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)auStack_298,(NewLineOr *)local_798);
  std::__cxx11::string::~string((string *)local_798);
  std::__cxx11::string::~string((string *)auStack_a8);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)auStack_4e8);
  std::__cxx11::string::~string((string *)local_ac8);
  std::__cxx11::string::~string((string *)&analyzer.verbose);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-onlylist",(allocator<char> *)auStack_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8,"",(allocator<char> *)&analyzer.verbose);
  Pass::getArgumentOrDefault
            ((string *)((long)&removeListInput.field_2 + 8),&pAStack_40->super_Pass,
             (string *)auStack_298,(string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)auStack_298);
  if (onlyListInput._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,"asyncify-whitelist",(allocator<char> *)&analyzer.verbose);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_4e8,"",(allocator<char> *)local_ac8);
    Pass::getArgumentOrDefault
              ((string *)auStack_298,&pAStack_40->super_Pass,(string *)local_3c8,
               (string *)auStack_4e8);
    std::__cxx11::string::operator=
              ((string *)(removeListInput.field_2._M_local_buf + 8),(string *)auStack_298);
    std::__cxx11::string::~string((string *)auStack_298);
    std::__cxx11::string::~string((string *)auStack_4e8);
    std::__cxx11::string::~string((string *)local_3c8);
  }
  read_possible_response_file((string *)local_3c8,(string *)((long)&removeListInput.field_2 + 8));
  String::trim((string *)auStack_298,(string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyzer.verbose,",",(allocator<char> *)local_ac8);
  std::__cxx11::string::string((string *)auStack_4e8,(string *)&analyzer.verbose);
  String::Split::Split
            ((Split *)&removeList.needToHandleBracketingOperations,(string *)auStack_298,
             (NewLineOr *)auStack_4e8);
  std::__cxx11::string::~string((string *)auStack_4e8);
  std::__cxx11::string::~string((string *)&analyzer.verbose);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-asserts",(allocator<char> *)local_3c8);
  __range4._5_1_ = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-verbose",(allocator<char> *)local_3c8);
  bVar9 = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_298);
  local_b0 = (_Base_ptr)CONCAT71(local_b0._1_7_,bVar9);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-relocatable",(allocator<char> *)local_3c8);
  __range4._4_1_ = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-in-secondary-memory",(allocator<char> *)local_3c8);
  bVar9 = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_298,"asyncify-propagate-addlist",(allocator<char> *)local_3c8);
  __range4._7_1_ = Pass::hasArgument(&pAStack_40->super_Pass,(string *)auStack_298);
  std::__cxx11::string::~string((string *)auStack_298);
  local_50 = module;
  if (bVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,"asyncify-secondary-memory-size",
               (allocator<char> *)&analyzer.verbose);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_4e8,"1",(allocator<char> *)local_ac8);
    Pass::getArgumentOrDefault
              ((string *)auStack_298,&pAStack_40->super_Pass,(string *)local_3c8,
               (string *)auStack_4e8);
    std::__cxx11::string::~string((string *)auStack_4e8);
    std::__cxx11::string::~string((string *)local_3c8);
    iVar11 = std::__cxx11::stoi((string *)auStack_298,(size_t *)0x0,10);
    pAVar25 = pAStack_40;
    sVar37 = (string_view)createSecondaryMemory(pAStack_40,module,(Address)(long)iVar11);
    (pAVar25->asyncifyMemory).super_IString.str = sVar37;
    std::__cxx11::string::~string((string *)auStack_298);
  }
  else if ((ulong)((long)(module->memories).
                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(module->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 9) {
    MemoryUtils::ensureExists(module);
    _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((module->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    pcVar5 = *(char **)((long)_Var1._M_t.
                              super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                              .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    (pAStack_40->asyncifyMemory).super_IString.str._M_len =
         *(size_t *)
          _Var1._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    (pAStack_40->asyncifyMemory).super_IString.str._M_str = pcVar5;
    pAVar25 = pAStack_40;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_298,"asyncify-memory",(allocator<char> *)&analyzer.verbose);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_4e8,"memory",(allocator<char> *)local_ac8);
    __range4._6_1_ = bVar10;
    Pass::getArgumentOrDefault
              ((string *)local_3c8,&pAStack_40->super_Pass,(string *)auStack_298,
               (string *)auStack_4e8);
    std::__cxx11::string::~string((string *)auStack_4e8);
    std::__cxx11::string::~string((string *)auStack_298);
    puVar2 = (module->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar29 = (module->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar2;
        puVar29 = puVar29 + 1) {
      pEVar3 = (puVar29->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((pEVar3->kind == Memory) &&
         (IString::IString((IString *)auStack_298,(string *)local_3c8),
         (pEVar3->name).super_IString.str._M_str == secondaryMemorySizeString._M_dataplus._M_p)) {
        pEVar3 = (puVar29->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        pvVar24 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        if ((pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
            super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_index == '\0') {
          pvVar24 = &pEVar3->value;
        }
        pcVar5 = (pvVar24->super__Variant_base<wasm::Name,_wasm::HeapType>).
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
                 super_IString.str._M_str;
        (pAStack_40->asyncifyMemory).super_IString.str._M_len =
             *(size_t *)
              &(pvVar24->super__Variant_base<wasm::Name,_wasm::HeapType>).
               super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
        (pAStack_40->asyncifyMemory).super_IString.str._M_str = pcVar5;
        module = local_50;
        break;
      }
      module = local_50;
    }
    if ((pAStack_40->asyncifyMemory).super_IString.str._M_str == (char *)0x0) {
      Fatal::Fatal((Fatal *)auStack_298);
      Fatal::operator<<((Fatal *)auStack_298,
                        (char (*) [93])
                        "Please specify which of the multiple memories to use, with --pass-arg=asyncify-memory@memory"
                       );
      goto LAB_0097812f;
    }
    std::__cxx11::string::~string((string *)local_3c8);
    pAVar25 = pAStack_40;
    bVar10 = __range4._6_1_;
  }
  pMVar12 = Module::getMemory(module,(Name)(pAVar25->asyncifyMemory).super_IString.str);
  (pAVar25->pointerType).id = (ulong)((pMVar12->addressType).id == 3) | 2;
  String::Split::Split((Split *)&listedImports.needToHandleBracketingOperations,(Split *)local_548);
  String::handleBracketingOperators
            ((Split *)auStack_298,(Split *)&listedImports.needToHandleBracketingOperations);
  String::Split::operator=((Split *)local_548,(Split *)auStack_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&listedImports.needToHandleBracketingOperations);
  String::Split::Split
            (&local_8f8,
             (Split *)&removeList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count);
  String::handleBracketingOperators((Split *)auStack_298,&local_8f8);
  String::Split::operator=
            ((Split *)&removeList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Split *)auStack_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8f8.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  String::Split::Split(&local_8d8,(Split *)&removeList.needToHandleBracketingOperations);
  String::handleBracketingOperators((Split *)auStack_298,&local_8d8);
  String::Split::operator=
            ((Split *)&removeList.needToHandleBracketingOperations,(Split *)auStack_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8d8.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if (((pointer)removeList._24_8_ ==
       onlyList.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((local_548 ==
       (undefined1  [8])
       removeList.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start &&
      ((pointer)removeList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       addList.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)))) {
    analyzer.module._0_1_ = bVar10 ^ 1;
    local_578._M_unused._0_8_ = (undefined8)((long)&__range4 + 3);
    local_560 = std::
                _Function_handler<bool_(wasm::Name,_wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:1693:33)>
                ::_M_invoke;
    local_568 = std::
                _Function_handler<bool_(wasm::Name,_wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:1693:33)>
                ::_M_manager;
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&analyzer.map;
    analyzer.map._M_t._M_impl._0_4_ = 0;
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_31 = (char)local_b0;
    analyzer.fakeGlobals.module =
         (Module *)&analyzer.fakeGlobals.map._M_h._M_rehash_policy._M_next_resize;
    analyzer.fakeGlobals.map._M_h._M_buckets = (__buckets_ptr)0x1;
    analyzer.fakeGlobals.map._M_h._M_bucket_count = 0;
    analyzer.fakeGlobals.map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    analyzer.fakeGlobals.map._M_h._M_element_count._0_4_ = 0x3f800000;
    analyzer.fakeGlobals.map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    analyzer.fakeGlobals.map._M_h._M_rehash_policy._4_4_ = 0;
    analyzer.fakeGlobals.map._M_h._M_rehash_policy._M_next_resize = 0;
    analyzer.fakeGlobals.map._M_h._M_single_bucket =
         (__node_base_ptr)&analyzer.fakeGlobals.rev._M_h._M_rehash_policy._M_next_resize;
    analyzer.fakeGlobals.rev._M_h._M_buckets = (__buckets_ptr)0x1;
    analyzer.fakeGlobals.rev._M_h._M_bucket_count = 0;
    analyzer.fakeGlobals.rev._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    analyzer.fakeGlobals.rev._M_h._M_element_count._0_4_ = 0x3f800000;
    analyzer.fakeGlobals.rev._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    analyzer.fakeGlobals.rev._M_h._M_rehash_policy._4_4_ = 0;
    analyzer.fakeGlobals.rev._M_h._M_rehash_policy._M_next_resize = 0;
    local_798 = (undefined1  [8])module;
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         analyzer.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)module;
    local_578._8_8_ = (undefined1 *)((long)&ignoreImports.field_2 + 8);
    __range4._2_1_ = (byte)analyzer.module;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&analyzer.verbose,"asyncify_fake_call_global_",
               (allocator<char> *)auStack_298);
    auStack_4e8 = (undefined1  [8])0x0;
    removeList_1.designation._M_dataplus._M_p = (pointer)0x0;
    removeList_1.designation.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:414:15)>
         ::_M_invoke;
    removeList_1.designation._M_string_length =
         (size_type)
         std::
         _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:414:15)>
         ::_M_manager;
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)auStack_298,
               (Module *)analyzer.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Func *)auStack_4e8);
    std::_Function_base::~_Function_base((_Function_base *)auStack_4e8);
    local_3c8 = (undefined1  [8])&instrumentedFuncs._M_h._M_rehash_policy._M_next_resize;
    instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
    instrumentedFuncs._M_h._M_bucket_count = 0;
    instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    instrumentedFuncs._M_h._M_element_count =
         CONCAT44(instrumentedFuncs._M_h._M_element_count._4_4_,0x3f800000);
    instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    instrumentedFuncs._M_h._M_rehash_policy._4_4_ = 0;
    instrumentedFuncs._M_h._M_rehash_policy._M_next_resize = 0;
    for (uVar13 = secondaryMemorySizeString.field_2._8_8_;
        (size_type *)uVar13 != &secondaryMemorySizeString._M_string_length;
        uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13)) {
      p_Var20 = (_Base_ptr)&((_Rb_tree_node_base *)(uVar13 + 0x20))->_M_right;
      while (p_Var20 = *(_Base_ptr *)p_Var20, p_Var20 != (_Base_ptr)0x0) {
        local_ac8 = (undefined1  [8])p_Var20->_M_parent;
        std::__detail::
        _Insert_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_3c8,(value_type *)local_ac8);
      }
    }
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>_>
                 *)&secondaryMemorySizeString);
    for (puVar31 = (undefined8 *)instrumentedFuncs._M_h._M_bucket_count;
        puVar31 != (undefined8 *)0x0; puVar31 = (undefined8 *)*puVar31) {
      local_110.id = puVar31[1];
      auStack_a8 = (undefined1  [8])local_110.id;
      wasm::Type::toString_abi_cxx11_((string *)auStack_4e8,&local_110);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &analyzer.verbose,(string *)auStack_4e8);
      std::__cxx11::string::~string((string *)auStack_4e8);
      IString::IString((IString *)auStack_4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_298);
      pmVar14 = std::__detail::
                _Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&analyzer.fakeGlobals,(key_type *)auStack_a8);
      (pmVar14->super_IString).str._M_len = (size_t)auStack_4e8;
      (pmVar14->super_IString).str._M_str = removeList_1.designation._M_dataplus._M_p;
      IString::IString((IString *)auStack_4e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_298);
      pmVar15 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Type>,_std::allocator<std::pair<const_wasm::Name,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Type>,_std::allocator<std::pair<const_wasm::Name,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&analyzer.fakeGlobals.map._M_h._M_single_bucket,
                             (key_type *)auStack_4e8);
      pmVar15->id = (uintptr_t)auStack_a8;
      IString::IString((IString *)local_ac8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_298);
      auVar26 = auStack_a8;
      pEVar16 = LiteralUtils::makeZero((Type)auStack_a8,local_50);
      name.super_IString.str._M_str = (char *)local_ac8;
      name.super_IString.str._M_len = (size_t)auStack_4e8;
      Builder::makeGlobal(name,(Type)onlyList_1.designation._M_dataplus._M_p,(Expression *)auVar26,
                          (Mutability)pEVar16);
      Module::addGlobal(local_50,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                                 auStack_4e8);
      std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
                ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_4e8);
      std::__cxx11::string::~string((string *)auStack_298);
    }
    std::
    _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_3c8);
    std::__cxx11::string::~string((string *)&analyzer.verbose);
    analyzer.fakeGlobals.rev._M_h._M_single_bucket._0_1_ = local_31;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&onlyList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "remove",(allocator<char> *)auStack_298);
    pMVar32 = local_50;
    anon_unknown_0::PatternMatcher::PatternMatcher
              ((PatternMatcher *)auStack_4e8,
               (string *)&onlyList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count,
               local_50,(Split *)local_548);
    std::__cxx11::string::~string
              ((string *)&onlyList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c8,"add",(allocator<char> *)auStack_298);
    anon_unknown_0::PatternMatcher::PatternMatcher
              ((PatternMatcher *)&analyzer.verbose,&local_9c8,pMVar32,
               (Split *)&removeList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9a8,"only",(allocator<char> *)auStack_298);
    anon_unknown_0::PatternMatcher::PatternMatcher
              ((PatternMatcher *)local_ac8,&local_9a8,pMVar32,
               (Split *)&removeList.needToHandleBracketingOperations);
    std::__cxx11::string::~string((string *)&local_9a8);
    renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&renamings;
    renamings._M_t._M_impl._0_4_ = 0;
    renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    renamings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    puVar30 = (pMVar32->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (pMVar32->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         renamings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (puVar30 == puVar4) {
        wasm::ModuleUtils::
        renameFunctions<std::map<wasm::Name,wasm::Name,std::less<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>
                  (pMVar32,(map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                            *)local_988);
        onlyListInput.field_2._8_8_ = 0;
        onlyListInput.field_2._8_8_ = operator_new(0x20);
        *(_Any_data **)onlyListInput.field_2._8_8_ = &local_578;
        *(char **)(onlyListInput.field_2._8_8_ + 8) = &local_31;
        *(Module **)(onlyListInput.field_2._8_8_ + 0x10) = pMVar32;
        *(long *)(onlyListInput.field_2._8_8_ + 0x18) = (long)&__range4 + 2;
        local_d0._M_unused._0_8_ = (undefined8)((long)&onlyListInput.field_2 + 8);
        local_110.id = (uintptr_t)pMVar32;
        scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&scanner.map
        ;
        scanner.map._M_t._M_impl._0_4_ = 0;
        scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_d0._8_8_ = pMVar32;
        local_b8 = std::
                   _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h:363:48)>
                   ::_M_invoke;
        auStack_a8 = (undefined1  [8])pMVar32;
        local_88 = (_Base_ptr)&stack0xffffffffffffff68;
        local_98 = (code *)((ulong)uStack_94 << 0x20);
        local_90._M_nxt = (_Hash_node_base *)0x0;
        local_78 = 0;
        local_c0 = std::
                   _Function_handler<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h:363:48)>
                   ::_M_manager;
        puVar4 = (pMVar32->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_80 = local_88;
        for (puVar30 = (pMVar32->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar4;
            puVar30 = puVar30 + 1) {
          auStack_298 = (undefined1  [8])
                        (puVar30->_M_t).
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          std::
          map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
          ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                        *)&type,(key_type *)auStack_298);
        }
        std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
        ::function((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                    *)&local_2b8,
                   (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                    *)&local_d0);
        puVar4 = *(pointer *)((long)auStack_a8 + 0x20);
        for (puVar30 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          *)((long)auStack_a8 + 0x18))->
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar4;
            puVar30 = puVar30 + 1) {
          pFVar22 = (puVar30->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          if ((pFVar22->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
            auStack_298 = (undefined1  [8])pFVar22;
            pmVar18 = std::
                      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                    *)&type,(key_type *)auStack_298);
            std::
            function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
            operator()((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                        *)&local_2b8,pFVar22,pmVar18);
          }
        }
        PassRunner::PassRunner((PassRunner *)local_3c8,(Module *)auStack_a8);
        auVar26 = auStack_a8;
        std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
        ::function((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                    *)&local_2d8,
                   (function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                    *)&local_2b8);
        wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::ModuleAnalyzer::
        Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm
        ::Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info&)>)::Mapper::Mapper(wasm::
        Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)::ModuleAnalyzer::Info,std::
        less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,wasm::
        (anonymous_namespace)::ModuleAnalyzer::Info>>>&,std::function<void(wasm::Function*,wasm::
        (anonymous_namespace)::ModuleAnalyzer::Info__>_
                  (auStack_298,(Module *)auVar26,(Map *)&type,(Func *)&local_2d8);
        auVar26 = auStack_a8;
        Pass::setPassRunner((Pass *)auStack_298,(PassRunner *)local_3c8);
        (**(code **)((long)auStack_298 + 0x10))((Pass *)auStack_298,auVar26);
        ::anon_func::Mapper::~Mapper((Mapper *)auStack_298);
        std::_Function_base::~_Function_base((_Function_base *)&local_2d8);
        PassRunner::~PassRunner((PassRunner *)local_3c8);
        std::_Function_base::~_Function_base((_Function_base *)&local_2b8);
        std::_Function_base::~_Function_base((_Function_base *)&local_d0);
        std::
        map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
        ::swap((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                *)&scanner,
               (map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                *)&type);
        for (p_Var20 = scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var20 != (_Base_ptr)&scanner.map;
            p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
          for (p_Var19 = *(_Rb_tree_node_base **)(p_Var20 + 2);
              p_Var19 != (_Rb_tree_node_base *)&p_Var20[1]._M_left;
              p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
            auStack_298 = *(undefined1 (*) [8])(p_Var19 + 1);
            pmVar18 = std::
                      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                    *)&scanner,(key_type *)auStack_298);
            std::
            _Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
            ::_M_insert_unique<wasm::Function*const&>
                      ((_Rb_tree<wasm::Function*,wasm::Function*,std::_Identity<wasm::Function*>,std::less<wasm::Function*>,std::allocator<wasm::Function*>>
                        *)&(pmVar18->super_FunctionInfo).calledBy,(Function **)(p_Var20 + 1));
          }
        }
        std::
        map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
        ::~map((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                *)&type);
        std::_Function_base::~_Function_base((_Function_base *)((long)&onlyListInput.field_2 + 8));
        for (p_Var20 = scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var20 != (_Base_ptr)&scanner.map;
            p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
          bVar9 = anon_unknown_0::PatternMatcher::match
                            ((PatternMatcher *)auStack_4e8,(Name)(*(IString **)(p_Var20 + 1))->str);
          if (bVar9) {
            *(byte *)((long)&p_Var20[5]._M_color + 3) = 1;
            if ((local_31 == '\x01') && ((char)p_Var20[5]._M_color == _S_black)) {
              poVar21 = std::operator<<((ostream *)&std::cout,"[asyncify] ");
              pcVar5 = *(char **)(p_Var20 + 1);
              name_00.super_IString.str._M_str = pcVar5;
              name_00.super_IString.str._M_len = *(size_t *)(pcVar5 + 8);
              poVar21 = wasm::operator<<((wasm *)poVar21,*(ostream **)pcVar5,name_00);
              std::operator<<(poVar21," is in the remove-list, ignore\n");
            }
            *(undefined1 *)&p_Var20[5]._M_color = _S_red;
          }
        }
        onlyList.needToHandleBracketingOperations = false;
        onlyList._25_7_ = 0;
        p_Var20 = scanner.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        while (pMVar32 = local_50, pIVar27 = (IString *)onlyList._24_8_,
              p_Var20 != (_Base_ptr)&scanner.map) {
          sVar6 = (*(value_type **)(p_Var20 + 1))[2].super_IString.str._M_len;
          if ((sVar6 != 0) && (sVar6 == wasm::(anonymous_namespace)::ASYNCIFY._8_8_)) {
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                       &onlyList.needToHandleBracketingOperations,*(value_type **)(p_Var20 + 1));
          }
          secondaryMemorySizeString._M_string_length = 0;
          auStack_298 = (undefined1  [8])0x0;
          secondaryMemorySizeString._M_dataplus._M_p = (pointer)0x0;
          local_b0 = p_Var20;
          for (p_Var19 = *(_Rb_tree_node_base **)(p_Var20 + 2);
              _Var8._M_p = secondaryMemorySizeString._M_dataplus._M_p, auVar26 = auStack_298,
              p_Var19 != (_Rb_tree_node_base *)&p_Var20[1]._M_left;
              p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
            local_3c8 = *(undefined1 (*) [8])(p_Var19 + 1);
            if ((*(long *)((long)local_3c8 + 0x20) != 0) &&
               (*(long *)((long)local_3c8 + 0x20) == wasm::(anonymous_namespace)::ASYNCIFY._8_8_)) {
              std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                        ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_298,
                         (value_type *)local_3c8);
            }
          }
          for (; auVar26 != (undefined1  [8])_Var8._M_p;
              auVar26 = (undefined1  [8])
                        &(((Function *)auVar26)->super_Importable).super_Named.name.super_IString.
                         str._M_str) {
            local_3c8 = (undefined1  [8])
                        (((Function *)auVar26)->super_Importable).super_Named.name.super_IString.str
                        ._M_len;
            std::
            _Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
            ::erase((_Rb_tree<wasm::Function_*,_wasm::Function_*,_std::_Identity<wasm::Function_*>,_std::less<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                     *)&p_Var20[1]._M_parent,(key_type *)local_3c8);
          }
          std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
                    ((_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                     auStack_298);
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(local_b0);
        }
        for (; pIVar27 != (IString *)0x0; pIVar27 = pIVar27 + 1) {
          Module::removeFunction(pMVar32,(Name)pIVar27->str);
        }
        local_3c8 = (undefined1  [8])
                    &removeList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count;
        instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)pMVar32;
        instrumentedFuncs._M_h._M_bucket_count = (size_type)&analyzer.verbose;
        instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)auStack_4e8;
        instrumentedFuncs._M_h._M_element_count = (size_type)&local_31;
        if (__range4._7_1_ != '\0') {
          anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer::anon_class_40_5_a2539eac::operator()
                    ((anon_class_40_5_a2539eac *)local_3c8,(Map *)&scanner);
        }
        local_d0._8_8_ = &addList.needToHandleBracketingOperations;
        addList.needToHandleBracketingOperations = false;
        addList._25_7_ = 0;
        auStack_a8 = (undefined1  [8])0x0;
        type.id = 0;
        local_90._M_nxt =
             (_Hash_node_base *)
             std::
             _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:722:27)>
             ::_M_invoke;
        local_98 = std::
                   _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:722:27)>
                   ::_M_manager;
        local_2d8._M_unused._M_object = (void *)0x0;
        local_2d8._8_8_ = 0;
        local_2c0 = std::
                    _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:723:27)>
                    ::_M_invoke;
        local_2c8 = std::
                    _Function_handler<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:723:27)>
                    ::_M_manager;
        local_2b8._M_unused._M_object = (void *)0x0;
        local_2b8._8_8_ = 0;
        local_2a0 = std::
                    _Function_handler<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:727:27)>
                    ::_M_invoke;
        local_2a8 = std::
                    _Function_handler<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:727:27)>
                    ::_M_manager;
        local_b8 = std::
                   _Function_handler<void_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:728:27)>
                   ::_M_invoke;
        local_c0 = std::
                   _Function_handler<void_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&,_wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp:728:27)>
                   ::_M_manager;
        local_d0._M_unused._M_object = &local_31;
        UniqueDeferredQueue<wasm::Function_*>::UniqueDeferredQueue
                  ((UniqueDeferredQueue<wasm::Function_*> *)auStack_298);
        puVar4 = *(pointer *)(local_110.id + 0x20);
        for (puVar30 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          *)(local_110.id + 0x18))->
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar4;
            puVar30 = puVar30 + 1) {
          local_70 = (undefined1  [8])
                     (puVar30->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          pmVar18 = std::
                    map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                  *)&scanner,(key_type *)local_70);
          bVar9 = std::function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
                  operator()((function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                              *)auStack_a8,pmVar18);
          if (bVar9) {
            local_70 = (undefined1  [8])
                       (puVar30->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            pmVar18 = std::
                      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                    *)&scanner,(key_type *)local_70);
            std::function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::operator()
                      ((function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *)
                       &local_2b8,pmVar18);
            UniqueDeferredQueue<wasm::Function_*>::push
                      ((UniqueDeferredQueue<wasm::Function_*> *)auStack_298,
                       (puVar30->_M_t).
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          }
        }
        do {
          bVar9 = UniqueDeferredQueue<wasm::Function_*>::empty
                            ((UniqueDeferredQueue<wasm::Function_*> *)auStack_298);
          pMVar32 = local_50;
          if (bVar9) {
            UniqueDeferredQueue<wasm::Function_*>::~UniqueDeferredQueue
                      ((UniqueDeferredQueue<wasm::Function_*> *)auStack_298);
            std::_Function_base::~_Function_base((_Function_base *)&local_d0);
            std::_Function_base::~_Function_base((_Function_base *)&local_2b8);
            std::_Function_base::~_Function_base((_Function_base *)&local_2d8);
            std::_Function_base::~_Function_base((_Function_base *)auStack_a8);
            if (addList._24_8_ != 0) {
              std::
              __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ();
              for (psVar28 = (string *)addList._24_8_; psVar28 != (string *)0x0;
                  psVar28 = psVar28 + 0x20) {
                std::operator<<((ostream *)&std::cout,psVar28);
              }
            }
            std::
            map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
            ::swap((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    *)&analyzer.canIndirectChangeState,
                   (map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    *)&scanner);
            if ((pointer)removeList._24_8_ !=
                onlyList.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              puVar4 = (pMVar32->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              puVar30 = (pMVar32->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              for (; puVar30 != puVar4; puVar30 = puVar30 + 1) {
                pFVar22 = (puVar30->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                if ((pFVar22->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
                  auStack_298 = (undefined1  [8])pFVar22;
                  pmVar18 = std::
                            map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                            ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                          *)&analyzer.canIndirectChangeState,(key_type *)auStack_298
                                        );
                  bVar9 = anon_unknown_0::PatternMatcher::match
                                    ((PatternMatcher *)local_ac8,
                                     (IString)*(IString *)
                                               &(((puVar30->_M_t).
                                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                                  .super__Head_base<0UL,_wasm::Function_*,_false>.
                                                 _M_head_impl)->super_Importable).super_Named);
                  pmVar18->canChangeState = bVar9;
                  if (bVar9) {
                    pmVar18->addedFromList = true;
                  }
                  if (local_31 == '\x01') {
                    poVar21 = std::operator<<((ostream *)&std::cout,"[asyncify] ");
                    pFVar22 = (puVar30->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                    name_01.super_IString.str._M_str = (char *)pFVar22;
                    name_01.super_IString.str._M_len =
                         (size_t)(pFVar22->super_Importable).super_Named.name.super_IString.str.
                                 _M_str;
                    poVar21 = wasm::operator<<((wasm *)poVar21,
                                               *(ostream **)&(pFVar22->super_Importable).super_Named
                                               ,name_01);
                    poVar21 = std::operator<<(poVar21,"\'s state is set based on the only-list to ")
                    ;
                    poVar21 = std::ostream::_M_insert<bool>(SUB81(poVar21,0));
                    std::operator<<(poVar21,'\n');
                  }
                }
                pMVar32 = local_50;
              }
            }
            if (__range4._7_1_ == '\0') {
              anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer::anon_class_40_5_a2539eac::operator()
                        ((anon_class_40_5_a2539eac *)local_3c8,
                         (Map *)&analyzer.canIndirectChangeState);
            }
            anon_unknown_0::PatternMatcher::checkPatternsMatches((PatternMatcher *)auStack_4e8);
            anon_unknown_0::PatternMatcher::checkPatternsMatches
                      ((PatternMatcher *)&analyzer.verbose);
            anon_unknown_0::PatternMatcher::checkPatternsMatches((PatternMatcher *)local_ac8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&addList.needToHandleBracketingOperations);
            std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                      ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)
                       &onlyList.needToHandleBracketingOperations);
            std::
            map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
            ::~map((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    *)&scanner);
            std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
            ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                         *)local_988);
            anon_unknown_0::PatternMatcher::~PatternMatcher((PatternMatcher *)local_ac8);
            anon_unknown_0::PatternMatcher::~PatternMatcher((PatternMatcher *)&analyzer.verbose);
            anon_unknown_0::PatternMatcher::~PatternMatcher((PatternMatcher *)auStack_4e8);
            std::_Function_base::~_Function_base((_Function_base *)&local_578);
            addGlobals(pAStack_40,pMVar32,(bool)__range4._4_1_);
            local_3c8 = (undefined1  [8])&instrumentedFuncs._M_h._M_rehash_policy._M_next_resize;
            instrumentedFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
            instrumentedFuncs._M_h._M_bucket_count = 0;
            instrumentedFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            instrumentedFuncs._M_h._M_element_count =
                 CONCAT44(instrumentedFuncs._M_h._M_element_count._4_4_,0x3f800000);
            instrumentedFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
            instrumentedFuncs._M_h._M_rehash_policy._4_4_ = 0;
            instrumentedFuncs._M_h._M_rehash_policy._M_next_resize = 0;
            puVar4 = (pMVar32->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar30 = (pMVar32->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pMVar32 = local_50,
                puVar30 != puVar4; puVar30 = puVar30 + 1) {
              bVar9 = anon_unknown_0::ModuleAnalyzer::needsInstrumentation
                                ((ModuleAnalyzer *)local_798,
                                 (puVar30->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
              if (bVar9) {
                auStack_298 = (undefined1  [8])
                              (puVar30->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
                std::__detail::
                _Insert<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                ::insert((_Insert<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                          *)local_3c8,(value_type *)auStack_298);
              }
            }
            PassUtils::FilteredPassRunner::FilteredPassRunner
                      ((FilteredPassRunner *)auStack_298,local_50,(FuncSet *)local_3c8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8b8,"flatten",(allocator<char> *)auStack_4e8);
            iVar11 = scanner.map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            local_c30._M_engaged = false;
            PassRunner::add((PassRunner *)auStack_298,&local_8b8,
                            (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_c30);
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset(&local_c30);
            std::__cxx11::string::~string((string *)&local_8b8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_898,"dce",(allocator<char> *)auStack_4e8);
            local_c08._M_engaged = false;
            PassRunner::add((PassRunner *)auStack_298,&local_898,
                            (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_c08);
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset(&local_c08);
            std::__cxx11::string::~string((string *)&local_898);
            if (0 < iVar11) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_878,"remove-unused-names",(allocator<char> *)auStack_4e8);
              local_be0._M_engaged = false;
              PassRunner::add((PassRunner *)auStack_298,&local_878,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_be0);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_be0);
              std::__cxx11::string::~string((string *)&local_878);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_858,"simplify-locals-nonesting",
                         (allocator<char> *)auStack_4e8);
              local_bb8._M_engaged = false;
              PassRunner::add((PassRunner *)auStack_298,&local_858,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_bb8);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_bb8);
              std::__cxx11::string::~string((string *)&local_858);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_838,"reorder-locals",(allocator<char> *)auStack_4e8);
              local_b90._M_engaged = false;
              PassRunner::add((PassRunner *)auStack_298,&local_838,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_b90);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_b90);
              std::__cxx11::string::~string((string *)&local_838);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_818,"coalesce-locals",(allocator<char> *)auStack_4e8);
              local_b68._M_engaged = false;
              PassRunner::add((PassRunner *)auStack_298,&local_818,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_b68);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_b68);
              std::__cxx11::string::~string((string *)&local_818);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_7f8,"simplify-locals-nonesting",
                         (allocator<char> *)auStack_4e8);
              local_b40._M_engaged = false;
              PassRunner::add((PassRunner *)auStack_298,&local_7f8,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_b40);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_b40);
              std::__cxx11::string::~string((string *)&local_7f8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_7d8,"reorder-locals",(allocator<char> *)auStack_4e8);
              local_b18._M_engaged = false;
              PassRunner::add((PassRunner *)auStack_298,&local_7d8,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_b18);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_b18);
              std::__cxx11::string::~string((string *)&local_7d8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_7b8,"merge-blocks",(allocator<char> *)auStack_4e8);
              local_af0._M_engaged = false;
              PassRunner::add((PassRunner *)auStack_298,&local_7b8,
                              (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_af0);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset(&local_af0);
              std::__cxx11::string::~string((string *)&local_7b8);
            }
            this_00.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
                 operator_new(0x98);
            anon_unknown_0::AsyncifyFlow::AsyncifyFlow
                      ((AsyncifyFlow *)
                       this_00.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,
                       (ModuleAnalyzer *)local_798,(Type)(pAStack_40->pointerType).id,
                       (Name)(pAStack_40->asyncifyMemory).super_IString.str);
            local_68._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
                 (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
                 (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
                 this_00.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
            PassRunner::add((PassRunner *)auStack_298,
                            (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_68);
            if ((_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
                local_68._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
              (**(code **)(*(long *)local_68._M_t.
                                    super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                    .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8))()
              ;
            }
            local_68._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
            super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
                 (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
                 (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)0x0;
            PassRunner::run((PassRunner *)auStack_298);
            PassRunner::~PassRunner((PassRunner *)auStack_298);
            if (__range4._5_1_ != '\0') {
              PassRunner::PassRunner((PassRunner *)auStack_298,pMVar32);
              local_60._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
              super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
                   (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)operator_new(0x88);
              p_Var7 = (_List_node_base *)(pAStack_40->asyncifyMemory).super_IString.str._M_str;
              *(_Base_ptr *)
               ((long)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8) = (_Base_ptr)0x0;
              ((_List_node_base *)
              ((long)local_60._M_t.
                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x10))->_M_next =
                   (_List_node_base *)
                   ((long)local_60._M_t.
                          super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                          super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x20);
              *(_Base_ptr *)
               ((long)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x18) =
                   (_Base_ptr)0x0;
              *(undefined1 *)
               &((_Base_ptr)
                ((long)local_60._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x20))->_M_color =
                   0;
              *(undefined1 *)
               &((_List_node_base *)
                ((long)local_60._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x50))->_M_next = 0
              ;
              *(undefined ***)
               local_60._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
                   &PTR__AsyncifyAssertInNonInstrumented_0111fad8;
              *(ModuleAnalyzer **)
               ((long)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x58) =
                   (ModuleAnalyzer *)local_798;
              p_Var20 = (_Base_ptr)(pAStack_40->asyncifyMemory).super_IString.str._M_len;
              *(uintptr_t *)
               ((long)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x60) =
                   (pAStack_40->pointerType).id;
              *(_Base_ptr *)
               ((long)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x68) = p_Var20;
              ((_List_node_base *)
              ((long)local_60._M_t.
                     super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                     super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x70))->_M_next =
                   p_Var7;
              *(_Base_ptr *)
               ((long)local_60._M_t.
                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                      super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 0x78) =
                   (_Base_ptr)0x0;
              PassRunner::add((PassRunner *)auStack_298,
                              (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_60)
              ;
              if ((_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
                  local_60._M_t.
                  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl != (Pass *)0x0) {
                (**(code **)(*(long *)local_60._M_t.
                                      super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                      .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl + 8))
                          ();
              }
              local_60._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
              super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
                   (tuple<wasm::Pass_*,_std::default_delete<wasm::Pass>_>)
                   (_Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>)0x0;
              PassRunner::run((PassRunner *)auStack_298);
              PassRunner::~PassRunner((PassRunner *)auStack_298);
            }
            PassUtils::FilteredPassRunner::FilteredPassRunner
                      ((FilteredPassRunner *)auStack_298,pMVar32,(FuncSet *)local_3c8);
            if (0 < iVar11) {
              PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)auStack_298);
            }
            this_01 = (AsyncifyLocals *)operator_new(0x1c8);
            anon_unknown_0::AsyncifyLocals::AsyncifyLocals
                      (this_01,(ModuleAnalyzer *)local_798,(Type)(pAStack_40->pointerType).id,
                       (Name)(pAStack_40->asyncifyMemory).super_IString.str);
            local_58._M_head_impl = (Pass *)this_01;
            PassRunner::add((PassRunner *)auStack_298,
                            (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_58);
            if ((AsyncifyLocals *)local_58._M_head_impl != (AsyncifyLocals *)0x0) {
              (*(((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                   *)&(local_58._M_head_impl)->_vptr_Pass)->super_Pass)._vptr_Pass[1])();
            }
            local_58._M_head_impl = (Pass *)0x0;
            if (0 < iVar11) {
              PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)auStack_298);
            }
            PassRunner::run((PassRunner *)auStack_298);
            PassRunner::~PassRunner((PassRunner *)auStack_298);
            addFunctions(pAStack_40,pMVar32);
            std::
            _Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::Function_*,_wasm::Function_*,_std::allocator<wasm::Function_*>,_std::__detail::_Identity,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_3c8);
            anon_unknown_0::ModuleAnalyzer::~ModuleAnalyzer((ModuleAnalyzer *)local_798);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&removeList.needToHandleBracketingOperations);
            std::__cxx11::string::~string((string *)(removeListInput.field_2._M_local_buf + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&removeList_1.unescaped._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_548);
            std::__cxx11::string::~string((string *)(stateChangingImports.field_2._M_local_buf + 8))
            ;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&ignoreImports.field_2 + 8));
            std::__cxx11::string::~string
                      ((string *)&renamings._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::__cxx11::string::~string((string *)local_5f8);
            return;
          }
          pFVar22 = UniqueDeferredQueue<wasm::Function_*>::pop
                              ((UniqueDeferredQueue<wasm::Function_*> *)auStack_298);
          local_558 = pFVar22;
          pmVar18 = std::
                    map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                    ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                  *)&scanner,&local_558);
          for (p_Var20 = (pmVar18->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left;
              (_Rb_tree_header *)p_Var20 !=
              &(pmVar18->super_FunctionInfo).calledBy._M_t._M_impl.super__Rb_tree_header;
              p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
            item = *(Function **)(p_Var20 + 1);
            func_3 = item;
            pmVar23 = std::
                      map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                      ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                    *)&scanner,&func_3);
            bVar9 = std::function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                    ::operator()((function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                                  *)&local_2d8,pmVar23);
            if (bVar9) {
              pmVar23 = std::
                        map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                        ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                      *)&scanner,&func_3);
              local_70 = (undefined1  [8])pFVar22;
              if (local_c0 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              (*local_b8)(&local_d0,(Function **)pmVar23,(Info *)local_70);
              pmVar23 = std::
                        map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                        ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                      *)&scanner,&func_3);
              bVar9 = std::
                      function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
                      operator()((function<bool_(const_wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>
                                  *)auStack_a8,pmVar23);
              if (!bVar9) {
                pmVar23 = std::
                          map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                          ::operator[]((map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                                        *)&scanner,&func_3);
                std::function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)>::
                operator()((function<void_(wasm::(anonymous_namespace)::ModuleAnalyzer::Info_&)> *)
                           &local_2b8,pmVar23);
                UniqueDeferredQueue<wasm::Function_*>::push
                          ((UniqueDeferredQueue<wasm::Function_*> *)auStack_298,item);
              }
            }
          }
        } while( true );
      }
      pFVar22 = (puVar30->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if ((pFVar22->super_Importable).module.super_IString.str._M_str ==
          (char *)wasm::(anonymous_namespace)::ASYNCIFY._8_8_) {
        pcVar5 = (pFVar22->super_Importable).base.super_IString.str._M_str;
        if (pcVar5 == (char *)wasm::(anonymous_namespace)::START_UNWIND._8_8_) {
          pmVar17 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_988,(key_type *)pFVar22);
          uVar33 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_START_UNWIND;
          uVar34 = wasm::(anonymous_namespace)::ASYNCIFY_START_UNWIND._4_4_;
          uVar35 = (undefined4)DAT_01175728;
          uVar36 = DAT_01175728._4_4_;
        }
        else if (pcVar5 == (char *)wasm::(anonymous_namespace)::STOP_UNWIND._8_8_) {
          pmVar17 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_988,(key_type *)pFVar22);
          uVar33 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_STOP_UNWIND;
          uVar34 = wasm::(anonymous_namespace)::ASYNCIFY_STOP_UNWIND._4_4_;
          uVar35 = (undefined4)DAT_01175738;
          uVar36 = DAT_01175738._4_4_;
        }
        else if (pcVar5 == (char *)wasm::(anonymous_namespace)::START_REWIND._8_8_) {
          pmVar17 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_988,(key_type *)pFVar22);
          uVar33 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_START_REWIND;
          uVar34 = wasm::(anonymous_namespace)::ASYNCIFY_START_REWIND._4_4_;
          uVar35 = (undefined4)DAT_01175748;
          uVar36 = DAT_01175748._4_4_;
        }
        else {
          if (pcVar5 != (char *)wasm::(anonymous_namespace)::STOP_REWIND._8_8_) {
            Fatal::Fatal((Fatal *)auStack_298);
            std::operator<<((ostream *)&secondaryMemorySizeString._M_string_length,
                            "call to unidenfied asyncify import: ");
            Fatal::operator<<((Fatal *)auStack_298,
                              &(((puVar30->_M_t).
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                               super_Importable).base);
            goto LAB_0097812f;
          }
          pmVar17 = std::
                    map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                    ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                  *)local_988,(key_type *)pFVar22);
          uVar33 = (undefined4)wasm::(anonymous_namespace)::ASYNCIFY_STOP_REWIND;
          uVar34 = wasm::(anonymous_namespace)::ASYNCIFY_STOP_REWIND._4_4_;
          uVar35 = (undefined4)DAT_01175758;
          uVar36 = DAT_01175758._4_4_;
        }
        *(undefined4 *)&(pmVar17->super_IString).str._M_len = uVar33;
        *(undefined4 *)((long)&(pmVar17->super_IString).str._M_len + 4) = uVar34;
        *(undefined4 *)&(pmVar17->super_IString).str._M_str = uVar35;
        *(undefined4 *)((long)&(pmVar17->super_IString).str._M_str + 4) = uVar36;
      }
      puVar30 = puVar30 + 1;
    } while( true );
  }
  Fatal::Fatal((Fatal *)auStack_298);
  Fatal::operator<<((Fatal *)auStack_298,
                    (char (*) [80])
                    "It makes no sense to use both an asyncify only-list together with another list."
                   );
LAB_0097812f:
  Fatal::~Fatal((Fatal *)auStack_298);
}

Assistant:

void run(Module* module) override {
    bool optimize = getPassOptions().optimizeLevel > 0;

    // Find which things can change the state.
    auto stateChangingImports = String::trim(read_possible_response_file(
      getArgumentOrDefault("asyncify-imports", "")));
    auto ignoreImports = getArgumentOrDefault("asyncify-ignore-imports", "");
    bool allImportsCanChangeState =
      stateChangingImports == "" && ignoreImports == "";
    String::Split listedImports(stateChangingImports,
                                String::Split::NewLineOr(","));
    // canIndirectChangeState is the default.  asyncify-ignore-indirect sets it
    // to false.
    auto canIndirectChangeState = !hasArgument("asyncify-ignore-indirect");
    std::string removeListInput =
      getArgumentOrDefault("asyncify-removelist", "");
    if (removeListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      removeListInput = getArgumentOrDefault("asyncify-blacklist", "");
    }
    String::Split removeList(
      String::trim(read_possible_response_file(removeListInput)),
      String::Split::NewLineOr(","));
    String::Split addList(String::trim(read_possible_response_file(
                            getArgumentOrDefault("asyncify-addlist", ""))),
                          String::Split::NewLineOr(","));
    std::string onlyListInput = getArgumentOrDefault("asyncify-onlylist", "");
    if (onlyListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      onlyListInput = getArgumentOrDefault("asyncify-whitelist", "");
    }
    String::Split onlyList(
      String::trim(read_possible_response_file(onlyListInput)),
      String::Split::NewLineOr(","));
    auto asserts = hasArgument("asyncify-asserts");
    auto verbose = hasArgument("asyncify-verbose");
    auto relocatable = hasArgument("asyncify-relocatable");
    auto secondaryMemory = hasArgument("asyncify-in-secondary-memory");
    auto propagateAddList = hasArgument("asyncify-propagate-addlist");

    // Ensure there is a memory, as we need it.

    if (secondaryMemory) {
      auto secondaryMemorySizeString =
        getArgumentOrDefault("asyncify-secondary-memory-size", "1");
      Address secondaryMemorySize = std::stoi(secondaryMemorySizeString);
      asyncifyMemory = createSecondaryMemory(module, secondaryMemorySize);
    } else {
      if (module->memories.size() <= 1) {
        MemoryUtils::ensureExists(module);
        asyncifyMemory = module->memories[0]->name;
      } else {
        auto asyncifyMemoryValue =
          getArgumentOrDefault("asyncify-memory", "memory");
        for (auto& theExport : module->exports) {
          if (theExport->kind == ExternalKind::Memory &&
              theExport->name == asyncifyMemoryValue) {
            asyncifyMemory = *theExport->getInternalName();
            break;
          }
        }
        if (!asyncifyMemory) {
          Fatal() << "Please specify which of the multiple memories to use, "
                     "with --pass-arg=asyncify-memory@memory";
        }
      }
    }
    pointerType =
      module->getMemory(asyncifyMemory)->is64() ? Type::i64 : Type::i32;

    removeList = handleBracketingOperators(removeList);
    addList = handleBracketingOperators(addList);
    onlyList = handleBracketingOperators(onlyList);

    if (!onlyList.empty() && (!removeList.empty() || !addList.empty())) {
      Fatal() << "It makes no sense to use both an asyncify only-list together "
                 "with another list.";
    }

    auto canImportChangeState = [&](Name module, Name base) {
      if (allImportsCanChangeState) {
        return true;
      }
      auto full = getFullImportName(module, base);
      for (auto& listedImport : listedImports) {
        if (String::wildcardMatch(listedImport, full)) {
          return true;
        }
      }
      return false;
    };

    // Scan the module.
    ModuleAnalyzer analyzer(*module,
                            canImportChangeState,
                            canIndirectChangeState,
                            removeList,
                            addList,
                            propagateAddList,
                            onlyList,
                            verbose);

    // Add necessary globals before we emit code to use them.
    addGlobals(module, relocatable);

    // Compute the set of functions we will instrument. All of the passes we run
    // below only need to run there.
    PassUtils::FuncSet instrumentedFuncs;
    for (auto& func : module->functions) {
      if (analyzer.needsInstrumentation(func.get())) {
        instrumentedFuncs.insert(func.get());
      }
    }

    // Instrument the flow of code, adding code instrumentation and
    // skips for when rewinding. We do this on flat IR so that it is
    // practical to add code around each call, without affecting
    // anything else.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      runner.add("flatten");
      // Dce is useful here, since AsyncifyFlow makes control flow conditional,
      // which may make unreachable code look reachable. It also lets us ignore
      // unreachable code here.
      runner.add("dce");
      if (optimize) {
        // Optimizing before AsyncifyFlow is crucial, especially coalescing,
        // because the flow changes add many branches, break up if-elses, etc.,
        // all of which extend the live ranges of locals. In other words, it is
        // not possible to coalesce well afterwards.
        runner.add("remove-unused-names");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("coalesce-locals");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("merge-blocks");
      }
      runner.add(
        std::make_unique<AsyncifyFlow>(&analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    if (asserts) {
      // Add asserts in non-instrumented code. Note we do not use an
      // instrumented pass runner here as we do want to run on all functions.
      PassRunner runner(module);
      runner.add(std::make_unique<AsyncifyAssertInNonInstrumented>(
        &analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Next, add local saving/restoring logic. We optimize before doing this,
    // to undo the extra code generated by flattening, and to arrive at the
    // minimal amount of locals (which is important as we must save and
    // restore those locals). We also and optimize after as well to simplify
    // the code as much as possible.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.add(std::make_unique<AsyncifyLocals>(
        &analyzer, pointerType, asyncifyMemory));
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Finally, add function support (that should not have been seen by
    // the previous passes).
    addFunctions(module);
  }